

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O2

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  int iVar1;
  Mat local_40;
  
  if (this->c == 0) {
    if (this->h == 0) {
      if (this->w == 0) {
        Mat::create(&this->data,1,4);
        goto LAB_0010e1ed;
      }
      (**mb->_vptr_ModelBin)(&local_40,mb,(ulong)(uint)this->w,1);
      Mat::operator=(&this->data,&local_40);
    }
    else {
      (*mb->_vptr_ModelBin[1])(&local_40,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,1);
      Mat::operator=(&this->data,&local_40);
    }
  }
  else {
    (*mb->_vptr_ModelBin[2])
              (&local_40,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->c,1);
    Mat::operator=(&this->data,&local_40);
  }
  Mat::~Mat(&local_40);
LAB_0010e1ed:
  if (((this->data).data == (void *)0x0) ||
     (iVar1 = 0, (long)(this->data).c * (this->data).cstep == 0)) {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}